

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLimit.cpp
# Opt level: O1

double __thiscall chrono::ChLinkLimit::GetViolation(ChLinkLimit *this,double x)

{
  double dVar1;
  double dVar2;
  
  if ((this->m_active == true) && (this->m_penalty_only == false)) {
    dVar1 = this->m_max;
    dVar2 = this->m_min;
    if ((x <= dVar2) || (dVar1 <= x)) {
      if (x <= dVar2) {
        return x - dVar2;
      }
      if (dVar1 <= x) {
        return x - dVar1;
      }
    }
  }
  return 0.0;
}

Assistant:

double ChLinkLimit::GetViolation(double x) const {
    if (!m_active || m_penalty_only)
        return 0;

    if (x > m_min && x < m_max)
        return 0;
    if (x <= m_min)
        return (x - m_min);
    if (x >= m_max)
        return (x - m_max);

    return 0;
}